

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O3

void __thiscall Assimp::StepExporter::WriteFile(StepExporter *this)

{
  undefined1 *this_00;
  _Rb_tree_header *p_Var1;
  aiVector3D *paVar2;
  aiVector3D *paVar3;
  _Rb_tree_header *p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  uint uVar17;
  aiMesh *paVar18;
  aiVector3D *paVar19;
  uint *puVar20;
  aiVector3D *paVar21;
  aiColor4D *paVar22;
  uint uVar23;
  int iVar24;
  mapped_type_conflict *pmVar25;
  tm *__tp;
  ostream *poVar26;
  size_t sVar27;
  mapped_type *pmVar28;
  _Rb_tree_node_base *p_Var29;
  aiScene *paVar30;
  aiVector3D *paVar31;
  _Base_ptr p_Var32;
  int iVar33;
  ulong uVar34;
  _Base_ptr p_Var35;
  _Base_ptr p_Var36;
  ulong uVar37;
  long lVar38;
  _Base_ptr p_Var39;
  _Base_ptr p_Var40;
  ulong uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  VectorIndexUMap uniqueVerts;
  char date_str [20];
  time_t date;
  int local_130;
  float local_ec;
  int local_e0;
  _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
  local_d0;
  ulong local_a0;
  undefined1 local_98 [24];
  ulong local_80;
  double local_78;
  double local_70;
  double local_68;
  key_type local_60;
  aiVector3D *local_58 [4];
  time_t local_38;
  
  *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) =
       *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) | 4;
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar41 = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar30 = this->mScene;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (paVar30->mNumMeshes != 0) {
    uVar34 = 0;
    uVar41 = 0;
    do {
      paVar18 = paVar30->mMeshes[uVar34];
      if ((ulong)paVar18->mNumFaces != 0) {
        lVar38 = 0;
        do {
          uVar41 = (ulong)((int)uVar41 +
                          (uint)(*(int *)((long)&paVar18->mFaces->mNumIndices + lVar38) == 3));
          lVar38 = lVar38 + 0x10;
        } while ((ulong)paVar18->mNumFaces << 4 != lVar38);
      }
      if (paVar18->mNumVertices != 0) {
        uVar37 = 0;
        do {
          local_58[0] = paVar18->mVertices + uVar37;
          if (local_d0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_003a90f6:
            pmVar25 = std::
                      map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                      ::operator[]((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                                    *)&local_d0,local_58);
            *pmVar25 = -1;
          }
          else {
            p_Var36 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var35 = &local_d0._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var39 = p_Var35;
              p_Var32 = p_Var36;
              paVar31 = *(aiVector3D **)(p_Var32 + 1);
              p_Var35 = p_Var32;
              if (paVar31 < local_58[0]) {
                p_Var35 = p_Var39;
              }
              p_Var36 = (&p_Var32->_M_left)[paVar31 < local_58[0]];
            } while ((&p_Var32->_M_left)[paVar31 < local_58[0]] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var35 == &local_d0._M_impl.super__Rb_tree_header)
            goto LAB_003a90f6;
            if (paVar31 < local_58[0]) {
              p_Var32 = p_Var39;
            }
            if (local_58[0] < *(aiVector3D **)(p_Var32 + 1)) goto LAB_003a90f6;
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 < paVar18->mNumVertices);
        paVar30 = this->mScene;
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < paVar30->mNumMeshes);
  }
  local_38 = time((time_t *)0x0);
  __tp = localtime(&local_38);
  strftime((char *)local_58,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  this_00 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ISO-10303-21",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"HEADER",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"FILE_DESCRIPTION((\'STEP AP214\'),\'1\')",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"FILE_NAME(\'",0xb);
  poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,(this->mFile)._M_dataplus._M_p,
                       (this->mFile)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar26,".stp\',\'",7);
  sVar27 = strlen((char *)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar26,(char *)local_58,sVar27);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar26,"\',(\' \'),(\' \'),\'Spatial InterOp 3D\',\' \',\' \')",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"FILE_SCHEMA((\'automotive_design\'))",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ENDSEC",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"DATA",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(\' \',("
             ,0x40);
  iVar24 = (int)uVar41;
  if (0 < iVar24) {
    lVar38 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      if ((ulong)(iVar24 - 1) * 0x1e != lVar38) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
      }
      lVar38 = lVar38 + 0x1e;
    } while (uVar41 * 0x1e != lVar38);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"),#6)",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#2=PRODUCT_DEFINITION_CONTEXT(\'\',#7,\'design\')",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#3=APPLICATION_PROTOCOL_DEFINITION(\'INTERNATIONAL STANDARD\',\'automotive_design\',1994,#7)"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#4=PRODUCT_CATEGORY_RELATIONSHIP(\'NONE\',\'NONE\',#8,#9)",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT(\'NONE\',\'WORKSPACE\'))"
             ,0xa8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#7=APPLICATION_CONTEXT(\' \')",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#8=PRODUCT_CATEGORY(\'part\',\'NONE\')",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#9=PRODUCT_RELATED_PRODUCT_CATEGORY(\'detail\',\' \',(#17))",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#10=PRODUCT_DEFINITION_SHAPE(\'NONE\',\'NONE\',#18)",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION(\'Root\',(#16,#19),#6)",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,\'\',\'\')",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#13=(CONVERSION_BASED_UNIT(\'METRE\',#20)LENGTH_UNIT()NAMED_UNIT(#21))",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))",0x3d
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#16=SHELL_BASED_SURFACE_MODEL(\'Root\',(#29))",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#17=PRODUCT(\'Root\',\'Root\',\'Root\',(#23))",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#18=PRODUCT_DEFINITION(\'NONE\',\'NONE\',#24,#2)",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#19=AXIS2_PLACEMENT_3D(\'\',#25,#26,#27)",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#23=PRODUCT_CONTEXT(\'\',#7,\'mechanical\')",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(\' \',\'NONE\',#17,.NOT_KNOWN.)"
             ,0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#25=CARTESIAN_POINT(\'\',(0.0,0.0,0.0))",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#26=DIRECTION(\'\',(0.0,0.0,1.0))",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#27=DIRECTION(\'\',(1.0,0.0,0.0))",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"#29=CLOSED_SHELL(\'\',(",0x15);
  if (0 < iVar24) {
    lVar38 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      if ((ulong)(iVar24 - 1) * 0x1e != lVar38) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
      }
      lVar38 = lVar38 + 0x1e;
    } while (uVar41 * 0x1e != lVar38);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"))",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  p_Var29 = (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var29 == p_Var1) {
    iVar24 = 100;
  }
  else {
    iVar24 = 100;
    do {
      local_60 = *(key_type *)(p_Var29 + 1);
      paVar18 = this->mScene->mMeshes[*(uint *)&p_Var29[1]._M_parent];
      pmVar28 = std::
                map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
                ::operator[](&this->trafos,&local_60);
      uVar23 = paVar18->mNumVertices;
      if (uVar23 != 0) {
        uVar41 = 0;
        do {
          paVar31 = paVar18->mVertices + uVar41;
          p_Var36 = &local_d0._M_impl.super__Rb_tree_header._M_header;
          p_Var35 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (local_d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            do {
              p_Var32 = p_Var35;
              p_Var40 = p_Var36;
              paVar19 = *(aiVector3D **)(p_Var32 + 1);
              p_Var39 = p_Var32;
              if (paVar19 < paVar31) {
                p_Var39 = p_Var40;
              }
              p_Var36 = p_Var39;
              p_Var35 = (&p_Var32->_M_left)[paVar19 < paVar31];
            } while ((&p_Var32->_M_left)[paVar19 < paVar31] != (_Base_ptr)0x0);
            p_Var4 = &local_d0._M_impl.super__Rb_tree_header;
            p_Var36 = &p_Var4->_M_header;
            if ((_Rb_tree_header *)p_Var39 != p_Var4) {
              if (paVar19 < paVar31) {
                p_Var32 = p_Var40;
              }
              p_Var36 = p_Var39;
              if (paVar31 < *(aiVector3D **)(p_Var32 + 1)) {
                p_Var36 = &p_Var4->_M_header;
              }
            }
          }
          if (*(int *)&p_Var36[1]._M_parent < 0) {
            *(int *)&p_Var36[1]._M_parent = iVar24;
            fVar43 = paVar31->x;
            fVar47 = paVar31->y;
            fVar52 = pmVar28->a2;
            fVar44 = pmVar28->a1;
            fVar51 = paVar31->z;
            fVar49 = pmVar28->a3;
            fVar5 = pmVar28->a4;
            fVar6 = pmVar28->b2;
            fVar7 = pmVar28->b1;
            fVar42 = pmVar28->b3;
            fVar46 = pmVar28->b4;
            fVar48 = pmVar28->c2;
            fVar50 = pmVar28->c1;
            fVar8 = pmVar28->c3;
            fVar9 = pmVar28->c4;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,*(int *)&p_Var36[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=CARTESIAN_POINT(\'\',(",0x15);
            poVar26 = std::ostream::_M_insert<double>
                                ((double)(fVar49 * fVar51 + fVar44 * fVar43 + fVar52 * fVar47 +
                                         fVar5));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>
                                ((double)(fVar42 * fVar51 + fVar7 * fVar43 + fVar6 * fVar47 + fVar46
                                         ));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>
                                ((double)(fVar51 * fVar8 + fVar43 * fVar50 + fVar47 * fVar48 + fVar9
                                         ));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,*(int *)&p_Var36[1]._M_parent + 1)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=VERTEX_POINT(\'\',#",0x12);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,*(int *)&p_Var36[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            iVar24 = iVar24 + 2;
            uVar23 = paVar18->mNumVertices;
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 < uVar23);
      }
      p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29);
    } while ((_Rb_tree_header *)p_Var29 != p_Var1);
  }
  paVar30 = this->mScene;
  if (paVar30->mNumMeshes != 0) {
    local_98._0_16_ = ZEXT816(0x3f4ccccd3f4ccccd);
    local_ec = 0.8;
    uVar41 = 0;
    do {
      local_80 = uVar41;
      paVar18 = paVar30->mMeshes[uVar41];
      uVar23 = paVar18->mNumFaces;
      if (uVar23 != 0) {
        uVar41 = 0;
        do {
          if (paVar18->mFaces[uVar41].mNumIndices == 3) {
            paVar31 = paVar18->mVertices;
            puVar20 = paVar18->mFaces[uVar41].mIndices;
            uVar23 = *puVar20;
            uVar16 = puVar20[1];
            uVar17 = puVar20[2];
            if (local_d0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              local_130 = (int)local_a0;
              p_Var36 = &local_d0._M_impl.super__Rb_tree_header._M_header;
              local_e0 = local_130;
            }
            else {
              paVar19 = paVar31 + uVar23;
              paVar2 = paVar31 + uVar16;
              paVar3 = paVar31 + uVar17;
              p_Var36 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var35 = &local_d0._M_impl.super__Rb_tree_header._M_header;
              do {
                p_Var39 = p_Var35;
                p_Var32 = p_Var36;
                paVar21 = *(aiVector3D **)(p_Var32 + 1);
                p_Var35 = p_Var32;
                if (paVar21 < paVar19) {
                  p_Var35 = p_Var39;
                }
                p_Var36 = (&p_Var32->_M_left)[paVar21 < paVar19];
              } while ((&p_Var32->_M_left)[paVar21 < paVar19] != (_Base_ptr)0x0);
              p_Var36 = &local_d0._M_impl.super__Rb_tree_header._M_header;
              p_Var40 = p_Var36;
              if (p_Var35 != p_Var36) {
                if (paVar21 < paVar19) {
                  p_Var32 = p_Var39;
                }
                p_Var40 = p_Var35;
                if (paVar19 < *(aiVector3D **)(p_Var32 + 1)) {
                  p_Var40 = p_Var36;
                }
              }
              local_130 = *(int *)&p_Var40[1]._M_parent;
              p_Var35 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var39 = p_Var36;
                p_Var32 = p_Var35;
                paVar19 = *(aiVector3D **)(p_Var32 + 1);
                p_Var36 = p_Var32;
                if (paVar19 < paVar2) {
                  p_Var36 = p_Var39;
                }
                p_Var35 = (&p_Var32->_M_left)[paVar19 < paVar2];
              } while ((&p_Var32->_M_left)[paVar19 < paVar2] != (_Base_ptr)0x0);
              p_Var35 = &local_d0._M_impl.super__Rb_tree_header._M_header;
              p_Var40 = p_Var35;
              if (p_Var36 != p_Var35) {
                if (paVar19 < paVar2) {
                  p_Var32 = p_Var39;
                }
                p_Var40 = p_Var36;
                if (paVar2 < *(aiVector3D **)(p_Var32 + 1)) {
                  p_Var40 = p_Var35;
                }
              }
              local_e0 = *(int *)&p_Var40[1]._M_parent;
              p_Var36 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var32 = p_Var36;
                p_Var39 = p_Var35;
                paVar19 = *(aiVector3D **)(p_Var32 + 1);
                p_Var35 = p_Var32;
                if (paVar19 < paVar3) {
                  p_Var35 = p_Var39;
                }
                p_Var36 = (&p_Var32->_M_left)[paVar19 < paVar3];
              } while ((&p_Var32->_M_left)[paVar19 < paVar3] != (_Base_ptr)0x0);
              p_Var1 = &local_d0._M_impl.super__Rb_tree_header;
              p_Var36 = &p_Var1->_M_header;
              if ((_Rb_tree_header *)p_Var35 != p_Var1) {
                if (paVar19 < paVar3) {
                  p_Var32 = p_Var39;
                }
                p_Var36 = p_Var35;
                if (paVar3 < *(aiVector3D **)(p_Var32 + 1)) {
                  p_Var36 = &p_Var1->_M_header;
                }
              }
            }
            paVar22 = paVar18->mColors[0];
            if ((paVar22 != (aiColor4D *)0x0) && (paVar18->mNumVertices != 0)) {
              uVar10 = paVar22[uVar23].r;
              uVar13 = paVar22[uVar23].g;
              uVar11 = paVar22[uVar16].r;
              uVar14 = paVar22[uVar16].g;
              uVar12 = paVar22[uVar17].r;
              uVar15 = paVar22[uVar17].g;
              auVar45._0_4_ = (float)uVar12 + (float)uVar11 + (float)uVar10 + 0.0;
              auVar45._4_4_ = (float)uVar15 + (float)uVar14 + (float)uVar13 + 0.0;
              auVar45._8_8_ = 0;
              local_98._0_16_ = divps(auVar45,_DAT_006b59b0);
              local_ec = (paVar22[uVar23].b + 0.0 + paVar22[uVar16].b + paVar22[uVar17].b) / 3.0;
            }
            fVar43 = paVar31[uVar16].x;
            fVar47 = paVar31[uVar16].y;
            fVar52 = paVar31[uVar23].x;
            fVar44 = paVar31[uVar23].y;
            fVar51 = paVar31[uVar16].z;
            fVar49 = paVar31[uVar23].z;
            fVar5 = paVar31[uVar17].x;
            fVar6 = paVar31[uVar17].y;
            fVar7 = paVar31[uVar17].z;
            local_a0 = (ulong)*(uint *)&p_Var36[1]._M_parent;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=STYLED_ITEM(\'\',(#",0x12);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"),#",3);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=PRESENTATION_STYLE_ASSIGNMENT((#",0x21);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=SURFACE_STYLE_USAGE(.BOTH.,#",0x1d);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=SURFACE_SIDE_STYLE(\'\',(#",0x19);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=SURFACE_STYLE_FILL_AREA(#",0x1a);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=FILL_AREA_STYLE(\'\',(#",0x16);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=FILL_AREA_STYLE_COLOUR(\'\',#",0x1c);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=COLOUR_RGB(\'\',",0xf);
            poVar26 = std::ostream::_M_insert<double>((double)(float)local_98._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)(float)local_98._4_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)local_ec);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=FACE_SURFACE(\'\',(#",0x13)
            ;
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"),#",3);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=PLANE(\'\',#",0xb);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=AXIS2_PLACEMENT_3D(\'\',#",0x18);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_130);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,", #",3);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=DIRECTION(\'\',(",0xf);
            fVar42 = fVar43 - fVar52;
            fVar46 = fVar47 - fVar44;
            fVar50 = fVar51 - fVar49;
            fVar48 = 1.0 / SQRT(fVar50 * fVar50 + fVar42 * fVar42 + fVar46 * fVar46);
            local_68 = (double)(fVar42 * fVar48);
            poVar26 = std::ostream::_M_insert<double>(local_68);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            local_70 = (double)(fVar46 * fVar48);
            poVar26 = std::ostream::_M_insert<double>(local_70);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            local_78 = (double)(fVar50 * fVar48);
            poVar26 = std::ostream::_M_insert<double>(local_78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=DIRECTION(\'\',(",0xf);
            fVar42 = fVar5 - fVar52;
            fVar46 = fVar6 - fVar44;
            fVar50 = fVar7 - fVar49;
            fVar48 = 1.0 / SQRT(fVar50 * fVar50 + fVar42 * fVar42 + fVar46 * fVar46);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar42 * fVar48));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar46 * fVar48));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar50 * fVar48));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=FACE_BOUND(\'\',#",0x10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=EDGE_LOOP(\'\',(#",0x10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0xf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0xf);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=ORIENTED_EDGE(\'\',*,*,#",0x17);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=ORIENTED_EDGE(\'\',*,*,#",0x17);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x11);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"=ORIENTED_EDGE(\'\',*,*,#",0x17);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=EDGE_CURVE(\'\',#",0x10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_130 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_e0 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.F.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=EDGE_CURVE(\'\',#",0x10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_e0 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            iVar33 = (int)local_a0 + 1;
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar33);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=EDGE_CURVE(\'\',#",0x10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar33);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_130 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",.T.)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=LINE(\'\',#",10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_130);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=LINE(\'\',#",10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_e0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=LINE(\'\',#",10);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,(int)local_a0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",#",2);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x1a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=VECTOR(\'\',#",0xc);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x1b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",1.0)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=VECTOR(\'\',#",0xc);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x1c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",1.0)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x1a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=VECTOR(\'\',#",0xc);
            poVar26 = (ostream *)std::ostream::operator<<(poVar26,iVar24 + 0x1d);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",1.0)",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x1b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=DIRECTION(\'\',(",0xf);
            poVar26 = std::ostream::_M_insert<double>(local_68);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>(local_70);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>(local_78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x1c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=DIRECTION(\'\',(",0xf);
            fVar43 = fVar5 - fVar43;
            fVar47 = fVar6 - fVar47;
            fVar51 = fVar7 - fVar51;
            fVar42 = 1.0 / SQRT(fVar51 * fVar51 + fVar43 * fVar43 + fVar47 * fVar47);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar43 * fVar42));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar47 * fVar42));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar51 * fVar42));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"#",1);
            poVar26 = (ostream *)std::ostream::operator<<(this_00,iVar24 + 0x1d);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"=DIRECTION(\'\',(",0xf);
            fVar52 = fVar52 - fVar5;
            fVar44 = fVar44 - fVar6;
            fVar49 = fVar49 - fVar7;
            fVar43 = 1.0 / SQRT(fVar49 * fVar49 + fVar52 * fVar52 + fVar44 * fVar44);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar52 * fVar43));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar44 * fVar43));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,",",1);
            poVar26 = std::ostream::_M_insert<double>((double)(fVar49 * fVar43));
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"))",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            iVar24 = iVar24 + 0x1e;
            uVar23 = paVar18->mNumFaces;
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 < uVar23);
        paVar30 = this->mScene;
      }
      uVar41 = local_80 + 1;
    } while (uVar41 < paVar30->mNumMeshes);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ENDSEC",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"END-ISO-10303-21",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::
  _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
  ::~_Rb_tree(&local_d0);
  return;
}

Assistant:

void StepExporter::WriteFile()
{
    // see http://shodhganga.inflibnet.ac.in:8080/jspui/bitstream/10603/14116/11/11_chapter%203.pdf
    // note, that all realnumber values must be comma separated in x files
    mOutput.setf(std::ios::fixed);
    // precision for double
    // see http://stackoverflow.com/questions/554063/how-do-i-print-a-double-value-with-full-precision-using-cout
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // standard color
    aiColor4D fColor;
    fColor.r = 0.8f;
    fColor.g = 0.8f;
    fColor.b = 0.8f;

    int ind = 100; // the start index to be used
    int faceEntryLen = 30; // number of entries for a triangle/face
    // prepare unique (count triangles and vertices)

    VectorIndexUMap uniqueVerts; // use a map to reduce find complexity to log(n)
    VectorIndexUMap::iterator it;
    int countFace = 0;

    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices == 3) countFace++;
        }
        for (unsigned int j=0; j<mesh->mNumVertices; ++j)
        {
            aiVector3D* v = &(mesh->mVertices[j]);
            it =uniqueVerts.find(v);
            if (it == uniqueVerts.end())
            {
                uniqueVerts[v] = -1; // first mark the vector as not transformed
            }
        }
    }

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    // write the header
    mOutput << "ISO-10303-21" << endstr;
    mOutput << "HEADER" << endstr;
    mOutput << "FILE_DESCRIPTION(('STEP AP214'),'1')" << endstr;
    mOutput << "FILE_NAME('" << mFile << ".stp','" << date_str << "',(' '),(' '),'Spatial InterOp 3D',' ',' ')" << endstr;
    mOutput << "FILE_SCHEMA(('automotive_design'))" << endstr;
    mOutput << "ENDSEC" << endstr;

    // write the top of data
    mOutput << "DATA" << endstr;
    mOutput << "#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(' ',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size();
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "),#6)" << endstr;

    mOutput << "#2=PRODUCT_DEFINITION_CONTEXT('',#7,'design')" << endstr;
    mOutput << "#3=APPLICATION_PROTOCOL_DEFINITION('INTERNATIONAL STANDARD','automotive_design',1994,#7)" << endstr;
    mOutput << "#4=PRODUCT_CATEGORY_RELATIONSHIP('NONE','NONE',#8,#9)" << endstr;
    mOutput << "#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)" << endstr;
    mOutput << "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT('NONE','WORKSPACE'))" << endstr;
    mOutput << "#7=APPLICATION_CONTEXT(' ')" << endstr;
    mOutput << "#8=PRODUCT_CATEGORY('part','NONE')" << endstr;
    mOutput << "#9=PRODUCT_RELATED_PRODUCT_CATEGORY('detail',' ',(#17))" << endstr;
    mOutput << "#10=PRODUCT_DEFINITION_SHAPE('NONE','NONE',#18)" << endstr;
    mOutput << "#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION('Root',(#16,#19),#6)" << endstr;
    mOutput << "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,'','')" << endstr;
    mOutput << "#13=(CONVERSION_BASED_UNIT('METRE',#20)LENGTH_UNIT()NAMED_UNIT(#21))" << endstr;
    mOutput << "#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))" << endstr;
    mOutput << "#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))" << endstr;
    mOutput << "#16=SHELL_BASED_SURFACE_MODEL('Root',(#29))" << endstr;
    mOutput << "#17=PRODUCT('Root','Root','Root',(#23))" << endstr;
    mOutput << "#18=PRODUCT_DEFINITION('NONE','NONE',#24,#2)" << endstr;
    mOutput << "#19=AXIS2_PLACEMENT_3D('',#25,#26,#27)" << endstr;
    mOutput << "#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)" << endstr;
    mOutput << "#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#23=PRODUCT_CONTEXT('',#7,'mechanical')" << endstr;
    mOutput << "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(' ','NONE',#17,.NOT_KNOWN.)" << endstr;
    mOutput << "#25=CARTESIAN_POINT('',(0.0,0.0,0.0))" << endstr;
    mOutput << "#26=DIRECTION('',(0.0,0.0,1.0))" << endstr;
    mOutput << "#27=DIRECTION('',(1.0,0.0,0.0))" << endstr;
    mOutput << "#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))" << endstr;
    mOutput << "#29=CLOSED_SHELL('',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size() + 8;
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "))" << endstr;

    // write all the unique transformed CARTESIAN and VERTEX
    for (MeshesByNodeMap::const_iterator it2 = meshes.begin(); it2 != meshes.end(); ++it2)
    {
        const aiNode& node = *(*it2).first;
        unsigned int mesh_idx = (*it2).second;

        const aiMesh* mesh = mScene->mMeshes[mesh_idx];
        aiMatrix4x4& trafo = trafos[&node];
        for (unsigned int i = 0; i < mesh->mNumVertices; ++i)
        {
            aiVector3D* v = &(mesh->mVertices[i]);
            it = uniqueVerts.find(v);
            if (it->second >=0 ) continue;
            it->second = ind; // this one is new, so set the index (ind)
            aiVector3D vt = trafo * (*v); // transform the coordinate
            mOutput << "#" << it->second << "=CARTESIAN_POINT('',(" << vt.x << "," << vt.y << "," << vt.z << "))" << endstr;
            mOutput << "#" << it->second+1 << "=VERTEX_POINT('',#" << it->second << ")" << endstr;
            ind += 2;
        }
    }

    // write the triangles
    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices != 3) continue;

            aiVector3D* v1 = &(mesh->mVertices[face->mIndices[0]]);
            aiVector3D* v2 = &(mesh->mVertices[face->mIndices[1]]);
            aiVector3D* v3 = &(mesh->mVertices[face->mIndices[2]]);
            aiVector3D dv12 = *v2 - *v1;
            aiVector3D dv23 = *v3 - *v2;
            aiVector3D dv31 = *v1 - *v3;
            aiVector3D dv13 = *v3 - *v1;
            dv12.Normalize();
            dv23.Normalize();
            dv31.Normalize();
            dv13.Normalize();

            int pid1 = uniqueVerts.find(v1)->second;
            int pid2 = uniqueVerts.find(v2)->second;
            int pid3 = uniqueVerts.find(v3)->second;

            // mean vertex color for the face if available
            if (mesh->HasVertexColors(0))
            {
                fColor.r = 0.0;
                fColor.g = 0.0;
                fColor.b = 0.0;
                fColor += mesh->mColors[0][face->mIndices[0]];
                fColor += mesh->mColors[0][face->mIndices[1]];
                fColor += mesh->mColors[0][face->mIndices[2]];
                fColor /= 3.0f;
            }

            int sid = ind; // the sub index
            mOutput << "#" << sid << "=STYLED_ITEM('',(#" << sid+1 << "),#" << sid+8 << ")" << endstr; /* the item that must be referenced in #1 */
            /* This is the color information of the Triangle */
            mOutput << "#" << sid+1 << "=PRESENTATION_STYLE_ASSIGNMENT((#" << sid+2 << "))" << endstr;
            mOutput << "#" << sid+2 << "=SURFACE_STYLE_USAGE(.BOTH.,#" << sid+3 << ")" << endstr;
            mOutput << "#" << sid+3 << "=SURFACE_SIDE_STYLE('',(#" << sid+4 << "))" << endstr;
            mOutput << "#" << sid+4 << "=SURFACE_STYLE_FILL_AREA(#" << sid+5 << ")" << endstr;
            mOutput << "#" << sid+5 << "=FILL_AREA_STYLE('',(#" << sid+6 << "))" << endstr;
            mOutput << "#" << sid+6 << "=FILL_AREA_STYLE_COLOUR('',#" << sid+7 << ")" << endstr;
            mOutput << "#" << sid+7 << "=COLOUR_RGB(''," << fColor.r << "," << fColor.g << "," << fColor.b << ")" << endstr;

            /* this is the geometry */
            mOutput << "#" << sid+8 << "=FACE_SURFACE('',(#" << sid+13 << "),#" << sid+9<< ",.T.)" << endstr; /* the face that must be referenced in 29 */

            /* 2 directions of the plane */
            mOutput << "#" << sid+9 << "=PLANE('',#" << sid+10 << ")" << endstr;
            mOutput << "#" << sid+10 << "=AXIS2_PLACEMENT_3D('',#" << pid1 << ", #" << sid+11 << ",#" << sid+12 << ")" << endstr;

            mOutput << "#" << sid+11 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+12 << "=DIRECTION('',(" << dv13.x << "," << dv13.y << "," << dv13.z << "))" << endstr;

            mOutput << "#" << sid+13 << "=FACE_BOUND('',#" << sid+14 << ",.T.)" << endstr;
            mOutput << "#" << sid+14 << "=EDGE_LOOP('',(#" << sid+15 << ",#" << sid+16 << ",#" << sid+17 << "))" << endstr;

            /* edge loop  */
            mOutput << "#" << sid+15 << "=ORIENTED_EDGE('',*,*,#" << sid+18 << ",.T.)" << endstr;
            mOutput << "#" << sid+16 << "=ORIENTED_EDGE('',*,*,#" << sid+19 << ",.T.)" << endstr;
            mOutput << "#" << sid+17 << "=ORIENTED_EDGE('',*,*,#" << sid+20 << ",.T.)" << endstr;

            /* oriented edges */
            mOutput << "#" << sid+18 << "=EDGE_CURVE('',#" << pid1+1 << ",#" << pid2+1 << ",#" << sid+21 << ",.F.)" << endstr;
            mOutput << "#" << sid+19 << "=EDGE_CURVE('',#" << pid2+1 << ",#" << pid3+1 << ",#" << sid+22 << ",.T.)" << endstr;
            mOutput << "#" << sid+20 << "=EDGE_CURVE('',#" << pid3+1 << ",#" << pid1+1 << ",#" << sid+23 << ",.T.)" << endstr;

            /* 3 lines and 3 vectors for the lines for the 3 edge curves */
            mOutput << "#" << sid+21 << "=LINE('',#" << pid1 << ",#" << sid+24 << ")" << endstr;
            mOutput << "#" << sid+22 << "=LINE('',#" << pid2 << ",#" << sid+25 << ")" << endstr;
            mOutput << "#" << sid+23 << "=LINE('',#" << pid3 << ",#" << sid+26 << ")" << endstr;
            mOutput << "#" << sid+24 << "=VECTOR('',#" << sid+27 << ",1.0)" << endstr;
            mOutput << "#" << sid+25 << "=VECTOR('',#" << sid+28 << ",1.0)" << endstr;
            mOutput << "#" << sid+26 << "=VECTOR('',#" << sid+29 << ",1.0)" << endstr;
            mOutput << "#" << sid+27 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+28 << "=DIRECTION('',(" << dv23.x << "," << dv23.y << "," << dv23.z << "))" << endstr;
            mOutput << "#" << sid+29 << "=DIRECTION('',(" << dv31.x << "," << dv31.y << "," << dv31.z << "))" << endstr;
            ind += faceEntryLen; // increase counter
        }
    }

    mOutput << "ENDSEC" << endstr; // end of data section
    mOutput << "END-ISO-10303-21" << endstr; // end of file
}